

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ProgramBinaryPersistenceReplaceShaderCase::executeForProgram
          (ProgramBinaryPersistenceReplaceShaderCase *this,Program *program,ShaderAllocator *shaders
          )

{
  ostringstream *this_00;
  TestLog *pTVar1;
  Shader *pSVar2;
  char *__s;
  allocator<char> local_211;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [384];
  
  pTVar1 = ((this->super_ProgramBinaryPersistenceCase).super_ProgramBinaryCase.super_TestCase.
            super_TestCase.super_TestNode.m_testCtx)->m_log;
  pSVar2 = Functional::anon_unknown_0::ShaderAllocator::get
                     (shaders,(this->super_ProgramBinaryPersistenceCase).m_shaderType);
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream(this_00);
  __s = glu::getShaderTypeName((this->super_ProgramBinaryPersistenceCase).m_shaderType);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,__s,&local_211);
  std::operator+(&local_1f0,"Deleting and replacing ",&local_210);
  std::operator+(&local_1d0,&local_1f0," shader");
  std::operator<<((ostream *)this_00,(string *)&local_1d0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  glu::Program::detachShader(program,pSVar2->m_shader);
  Functional::anon_unknown_0::ShaderAllocator::deleteShader
            (shaders,(this->super_ProgramBinaryPersistenceCase).m_shaderType);
  pSVar2 = Functional::anon_unknown_0::ShaderAllocator::createShader
                     (shaders,(this->super_ProgramBinaryPersistenceCase).m_shaderType);
  glu::Program::attachShader(program,pSVar2->m_shader);
  return;
}

Assistant:

void executeForProgram (glu::Program& program, ShaderAllocator& shaders)
	{
		TestLog&		log			= m_testCtx.getLog();
		glu::Shader&	caseShader	= shaders.get(m_shaderType);

		log << TestLog::Message << "Deleting and replacing " + std::string(getShaderTypeName(m_shaderType)) + " shader" << TestLog::EndMessage;
		program.detachShader(caseShader.getShader());
		shaders.deleteShader(m_shaderType);
		program.attachShader(shaders.createShader(m_shaderType).getShader());
	}